

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

void __thiscall
ON_ClassArray<ON_3dmConstructionPlane>::Append
          (ON_ClassArray<ON_3dmConstructionPlane> *this,ON_3dmConstructionPlane *x)

{
  uint uVar1;
  ON_3dmConstructionPlane *pOVar2;
  uint uVar3;
  uint uVar5;
  ON_3dmConstructionPlane temp;
  ON_3dmConstructionPlane OStack_c8;
  int iVar4;
  
  uVar1 = this->m_count;
  if (uVar1 == this->m_capacity) {
    if (((int)uVar1 < 8) || ((ulong)((long)(int)uVar1 * 0xa8) < 0x10000001)) {
      uVar5 = 4;
      if (2 < (int)uVar1) {
        uVar5 = uVar1 * 2;
      }
    }
    else {
      uVar5 = 0x18618e;
      if (uVar1 < 0x18618e) {
        uVar5 = uVar1;
      }
      uVar5 = uVar5 + uVar1;
    }
    pOVar2 = this->m_a;
    if ((pOVar2 != (ON_3dmConstructionPlane *)0x0) &&
       (iVar4 = (int)((ulong)((long)x - (long)pOVar2) >> 3), uVar3 = iVar4 * 0x3cf3cf3d,
       (uVar1 != uVar3 && SBORROW4(uVar1,uVar3) == (int)(uVar1 + iVar4 * -0x3cf3cf3d) < 0) &&
       -1 < (int)uVar3)) {
      ON_3dmConstructionPlane::ON_3dmConstructionPlane(&OStack_c8);
      memcpy(&OStack_c8,x,0x99);
      ON_wString::operator=(&OStack_c8.m_name,&x->m_name);
      if ((uint)this->m_capacity < uVar5) {
        SetCapacity(this,(long)(int)uVar5);
      }
      pOVar2 = this->m_a;
      if (pOVar2 == (ON_3dmConstructionPlane *)0x0) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                   ,0x6bc,"","allocation failure");
      }
      else {
        iVar4 = this->m_count;
        this->m_count = iVar4 + 1;
        memcpy(pOVar2 + iVar4,&OStack_c8,0x99);
        ON_wString::operator=(&pOVar2[iVar4].m_name,&OStack_c8.m_name);
      }
      ON_3dmConstructionPlane::~ON_3dmConstructionPlane(&OStack_c8);
      return;
    }
    if (uVar1 < uVar5) {
      SetCapacity(this,(long)(int)uVar5);
      pOVar2 = this->m_a;
    }
    if (pOVar2 == (ON_3dmConstructionPlane *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x6c6,"","allocation failure");
      return;
    }
    uVar1 = this->m_count;
  }
  else {
    pOVar2 = this->m_a;
  }
  this->m_count = uVar1 + 1;
  memcpy(pOVar2 + (int)uVar1,x,0x99);
  ON_wString::operator=(&pOVar2[(int)uVar1].m_name,&x->m_name);
  return;
}

Assistant:

void ON_ClassArray<T>::Append( const T& x ) 
{
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if (m_a)
    {
      const int s = (int)(&x - m_a); // (int) cast is for 64 bit pointers
      if ( s >= 0 && s < m_capacity )
      {
        // 26 Sep 2005 Dale Lear
        //    User passed in an element of the m_a[]
        //    that will get reallocated by the call
        //    to Reserve(newcapacity).
        T temp;   // ON_*Array<> templates do not require robust copy constructor.
        temp = x; // ON_*Array<> templates require a robust operator=.
        Reserve( newcapacity );
        if (nullptr == m_a)
        {
          ON_ERROR("allocation failure");
          return;
        }
        m_a[m_count++] = temp;
        return;
      }
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = x;
}